

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timediff.c
# Opt level: O0

timeval * curlx_mstotv(timeval *tv,timediff_t ms)

{
  timediff_t tv_usec;
  timediff_t tv_sec;
  timediff_t ms_local;
  timeval *tv_local;
  
  if (tv == (timeval *)0x0) {
    tv_local = (timeval *)0x0;
  }
  else if (ms < 0) {
    tv_local = (timeval *)0x0;
  }
  else {
    tv_local = tv;
    if (ms < 1) {
      tv->tv_sec = 0;
      tv->tv_usec = 0;
    }
    else {
      tv->tv_sec = ms / 1000;
      tv->tv_usec = (ms % 1000) * 1000;
    }
  }
  return tv_local;
}

Assistant:

struct timeval *curlx_mstotv(struct timeval *tv, timediff_t ms)
{
  if(!tv)
    return NULL;

  if(ms < 0)
    return NULL;

  if(ms > 0) {
    timediff_t tv_sec = ms / 1000;
    timediff_t tv_usec = (ms % 1000) * 1000; /* max=999999 */
#ifdef HAVE_SUSECONDS_T
#if TIMEDIFF_T_MAX > TIME_T_MAX
    /* tv_sec overflow check in case time_t is signed */
    if(tv_sec > TIME_T_MAX)
      tv_sec = TIME_T_MAX;
#endif
    tv->tv_sec = (time_t)tv_sec;
    tv->tv_usec = (suseconds_t)tv_usec;
#elif defined(_WIN32) /* maybe also others in the future */
#if TIMEDIFF_T_MAX > LONG_MAX
    /* tv_sec overflow check on Windows there we know it is long */
    if(tv_sec > LONG_MAX)
      tv_sec = LONG_MAX;
#endif
    tv->tv_sec = (long)tv_sec;
    tv->tv_usec = (long)tv_usec;
#else
#if TIMEDIFF_T_MAX > INT_MAX
    /* tv_sec overflow check in case time_t is signed */
    if(tv_sec > INT_MAX)
      tv_sec = INT_MAX;
#endif
    tv->tv_sec = (int)tv_sec;
    tv->tv_usec = (int)tv_usec;
#endif
  }
  else {
    tv->tv_sec = 0;
    tv->tv_usec = 0;
  }

  return tv;
}